

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O2

TestResult *
JsonTest::checkEqual<char_const*,std::__cxx11::string>
          (TestResult *result,char *expected,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual,char *file,
          uint line,char *expr)

{
  bool bVar1;
  TestResult *pTVar2;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  char *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = expr;
  std::__cxx11::string::string((string *)&local_50,expected,&local_61);
  local_60 = actual;
  bVar1 = std::operator!=(&local_50,actual);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    TestResult::addFailure(result,file,line,local_58);
    pTVar2 = TestResult::operator<<(result,(char (*) [11])"Expected: ");
    std::__cxx11::string::string((string *)&local_50,expected,&local_61);
    pTVar2 = TestResult::operator<<(pTVar2,&local_50);
    TestResult::operator<<(pTVar2,(char (*) [2])0x14b14b);
    std::__cxx11::string::~string((string *)&local_50);
    pTVar2 = TestResult::operator<<(result,(char (*) [11])"Actual  : ");
    TestResult::operator<<(pTVar2,local_60);
  }
  return result;
}

Assistant:

TestResult& checkEqual(TestResult& result,
                       T expected,
                       U actual,
                       const char* file,
                       unsigned int line,
                       const char* expr) {
  if (static_cast<U>(expected) != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: " << static_cast<U>(expected) << "\n";
    result << "Actual  : " << actual;
  }
  return result;
}